

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcPrint.c
# Opt level: O3

float Abc_NtkMfsTotalGlitchingLut(Abc_Ntk_t *pNtk,int nPats,int Prob,int fVerbose)

{
  word *pGateTruth;
  int iVar1;
  int nRegs;
  void *pvVar2;
  long *plVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  Vec_Ptr_t *__ptr;
  Vec_Int_t *p;
  int *piVar8;
  Vec_Int_t *vTruth;
  void *pvVar9;
  Gli_Man_t *p_00;
  uint *puVar10;
  Vec_Ptr_t *pVVar11;
  long lVar12;
  long lVar13;
  float fVar14;
  int local_5c;
  
  if (pNtk->ntkType != ABC_NTK_LOGIC) {
    __assert_fail("Abc_NtkIsLogic(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcPrint.c"
                  ,0x6ee,"float Abc_NtkMfsTotalGlitchingLut(Abc_Ntk_t *, int, int, int)");
  }
  iVar4 = Abc_NtkGetFaninMax(pNtk);
  if (6 < iVar4) {
    __assert_fail("Abc_NtkGetFaninMax(pNtk) <= 6",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcPrint.c"
                  ,0x6ef,"float Abc_NtkMfsTotalGlitchingLut(Abc_Ntk_t *, int, int, int)");
  }
  iVar4 = Abc_NtkGetFaninMax(pNtk);
  if (iVar4 < 7) {
    Abc_NtkToAig(pNtk);
    pvVar9 = (void *)0x0;
    __ptr = Abc_NtkDfs(pNtk,0);
    p = (Vec_Int_t *)malloc(0x10);
    p->nCap = 0x10;
    p->nSize = 0;
    piVar8 = (int *)malloc(0x40);
    p->pArray = piVar8;
    vTruth = (Vec_Int_t *)malloc(0x10);
    vTruth->nCap = 0x1000;
    vTruth->nSize = 0;
    piVar8 = (int *)malloc(0x4000);
    vTruth->pArray = piVar8;
    iVar4 = pNtk->vObjs->nSize;
    piVar8 = (int *)malloc(0x10);
    iVar6 = 0x10;
    if (0xe < iVar4 - 1U) {
      iVar6 = iVar4;
    }
    *piVar8 = iVar6;
    if (iVar6 != 0) {
      pvVar9 = malloc((long)iVar6 << 3);
    }
    *(void **)(piVar8 + 2) = pvVar9;
    piVar8[1] = iVar4;
    memset(pvVar9,0,(long)iVar4 << 3);
    iVar6 = pNtk->vCis->nSize;
    iVar7 = __ptr->nSize;
    iVar1 = pNtk->vCos->nSize;
    nRegs = pNtk->nObjCounts[8];
    iVar5 = Abc_NtkGetTotalFanins(pNtk);
    p_00 = Gli_ManAlloc(iVar6 + iVar7 + iVar1,nRegs,iVar5 + pNtk->vCos->nSize);
    pVVar11 = pNtk->vObjs;
    if (0 < pVVar11->nSize) {
      lVar12 = 0;
      do {
        if (pVVar11->pArray[lVar12] != (void *)0x0) {
          *(undefined4 *)((long)pVVar11->pArray[lVar12] + 0x40) = 0xffffffff;
          pVVar11 = pNtk->vObjs;
        }
        lVar12 = lVar12 + 1;
      } while (lVar12 < pVVar11->nSize);
    }
    pVVar11 = pNtk->vCis;
    if (0 < pVVar11->nSize) {
      lVar12 = 0;
      do {
        pvVar2 = pVVar11->pArray[lVar12];
        iVar6 = Gli_ManCreateCi(p_00,*(int *)((long)pvVar2 + 0x2c));
        *(int *)((long)pvVar2 + 0x40) = iVar6;
        lVar12 = lVar12 + 1;
        pVVar11 = pNtk->vCis;
      } while (lVar12 < pVVar11->nSize);
    }
    if (0 < __ptr->nSize) {
      lVar12 = 0;
      do {
        plVar3 = (long *)__ptr->pArray[lVar12];
        p->nSize = 0;
        iVar6 = *(int *)((long)plVar3 + 0x1c);
        if (0 < iVar6) {
          lVar13 = 0;
          do {
            Vec_IntPush(p,*(int *)(*(long *)(*(long *)(*(long *)(*plVar3 + 0x20) + 8) +
                                            (long)*(int *)(plVar3[4] + lVar13 * 4) * 8) + 0x40));
            lVar13 = lVar13 + 1;
            iVar6 = *(int *)((long)plVar3 + 0x1c);
          } while (lVar13 < iVar6);
        }
        puVar10 = Hop_ManConvertAigToTruth
                            ((Hop_Man_t *)pNtk->pManFunc,(Hop_Obj_t *)plVar3[7],iVar6,vTruth,0);
        iVar6 = (int)plVar3[2];
        if (((long)iVar6 < 0) || (iVar4 <= iVar6)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWrd.h"
                        ,0x1be,"word *Vec_WrdEntryP(Vec_Wrd_t *, int)");
        }
        pGateTruth = (word *)((long)pvVar9 + (long)iVar6 * 8);
        *pGateTruth = CONCAT44(puVar10[*(int *)((long)plVar3 + 0x1c) == 6],*puVar10);
        iVar6 = Gli_ManCreateNode(p_00,p,*(int *)((long)plVar3 + 0x2c),pGateTruth);
        *(int *)(plVar3 + 8) = iVar6;
        lVar12 = lVar12 + 1;
      } while (lVar12 < __ptr->nSize);
    }
    pVVar11 = pNtk->vCos;
    if (0 < pVVar11->nSize) {
      lVar12 = 0;
      do {
        Gli_ManCreateCo(p_00,*(int *)(*(long *)(*(long *)(*(long *)(*pVVar11->pArray[lVar12] + 0x20)
                                                         + 8) +
                                               (long)**(int **)((long)pVVar11->pArray[lVar12] + 0x20
                                                               ) * 8) + 0x40));
        lVar12 = lVar12 + 1;
        pVVar11 = pNtk->vCos;
      } while (lVar12 < pVVar11->nSize);
    }
    iVar4 = 0;
    Gli_ManSwitchesAndGlitches(p_00,4000,0.125,0);
    pVVar11 = pNtk->vObjs;
    local_5c = 0;
    if (0 < pVVar11->nSize) {
      lVar12 = 0;
      local_5c = 0;
      iVar4 = 0;
      do {
        pvVar9 = pVVar11->pArray[lVar12];
        if ((pvVar9 != (void *)0x0) && (-1 < *(int *)((long)pvVar9 + 0x40))) {
          iVar6 = *(int *)((long)pvVar9 + 0x2c);
          iVar7 = Gli_ObjNumSwitches(p_00,*(int *)((long)pvVar9 + 0x40));
          local_5c = local_5c + iVar7 * iVar6;
          iVar6 = *(int *)((long)pvVar9 + 0x2c);
          iVar7 = Gli_ObjNumGlitches(p_00,*(int *)((long)pvVar9 + 0x40));
          iVar4 = iVar4 + iVar7 * iVar6;
          pVVar11 = pNtk->vObjs;
        }
        lVar12 = lVar12 + 1;
      } while (lVar12 < pVVar11->nSize);
    }
    Gli_ManStop(p_00);
    if (__ptr->pArray != (void **)0x0) {
      free(__ptr->pArray);
    }
    free(__ptr);
    if (vTruth->pArray != (int *)0x0) {
      free(vTruth->pArray);
    }
    free(vTruth);
    if (p->pArray != (int *)0x0) {
      free(p->pArray);
    }
    free(p);
    if (*(void **)(piVar8 + 2) != (void *)0x0) {
      free(*(void **)(piVar8 + 2));
    }
    free(piVar8);
    if (local_5c == 0) {
      fVar14 = 0.0;
    }
    else {
      fVar14 = ((float)(iVar4 - local_5c) * 100.0) / (float)local_5c;
    }
  }
  else {
    puts(
        "Abc_NtkMfsTotalGlitching() This procedure works only for mapped networks with LUTs size up to 6 inputs."
        );
    fVar14 = -1.0;
  }
  return fVar14;
}

Assistant:

float Abc_NtkMfsTotalGlitchingLut( Abc_Ntk_t * pNtk, int nPats, int Prob, int fVerbose )
{
    int nSwitches, nGlitches;
    Gli_Man_t * p;
    Vec_Ptr_t * vNodes;
    Vec_Int_t * vFanins, * vTruth;
    Abc_Obj_t * pObj, * pFanin;
    Vec_Wrd_t * vTruths; word * pTruth;
    unsigned * puTruth;
    int i, k;
    assert( Abc_NtkIsLogic(pNtk) );
    assert( Abc_NtkGetFaninMax(pNtk) <= 6 );
    if ( Abc_NtkGetFaninMax(pNtk) > 6 )
    {
        printf( "Abc_NtkMfsTotalGlitching() This procedure works only for mapped networks with LUTs size up to 6 inputs.\n" );
        return -1.0;
    }
    Abc_NtkToAig( pNtk );
    vNodes = Abc_NtkDfs( pNtk, 0 );
    vFanins = Vec_IntAlloc( 6 );
    vTruth = Vec_IntAlloc( 1 << 12 );
    vTruths = Vec_WrdStart( Abc_NtkObjNumMax(pNtk) );

    // derive network for glitch computation
    p = Gli_ManAlloc( Vec_PtrSize(vNodes) + Abc_NtkCiNum(pNtk) + Abc_NtkCoNum(pNtk),
        Abc_NtkLatchNum(pNtk), Abc_NtkGetTotalFanins(pNtk) + Abc_NtkCoNum(pNtk) );
    Abc_NtkForEachObj( pNtk, pObj, i )
        pObj->iTemp = -1;
    Abc_NtkForEachCi( pNtk, pObj, i )
        pObj->iTemp = Gli_ManCreateCi( p, Abc_ObjFanoutNum(pObj) );
    Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pObj, i )
    {
        Vec_IntClear( vFanins );
        Abc_ObjForEachFanin( pObj, pFanin, k )
            Vec_IntPush( vFanins, pFanin->iTemp );
        puTruth = Hop_ManConvertAigToTruth( (Hop_Man_t *)pNtk->pManFunc, (Hop_Obj_t *)pObj->pData, Abc_ObjFaninNum(pObj), vTruth, 0 );
        pTruth = Vec_WrdEntryP( vTruths, Abc_ObjId(pObj) );
        *pTruth = ((word)puTruth[Abc_ObjFaninNum(pObj) == 6] << 32) | (word)puTruth[0];
        pObj->iTemp = Gli_ManCreateNode( p, vFanins, Abc_ObjFanoutNum(pObj), pTruth );
    }
    Abc_NtkForEachCo( pNtk, pObj, i )
        Gli_ManCreateCo( p, Abc_ObjFanin0(pObj)->iTemp );

    // compute glitching
    Gli_ManSwitchesAndGlitches( p, 4000, 1.0/8.0, 0 );

    // compute the ratio
    nSwitches = nGlitches = 0;
    Abc_NtkForEachObj( pNtk, pObj, i )
        if ( pObj->iTemp >= 0 )
        {
            nSwitches += Abc_ObjFanoutNum(pObj) * Gli_ObjNumSwitches(p, pObj->iTemp);
            nGlitches += Abc_ObjFanoutNum(pObj) * Gli_ObjNumGlitches(p, pObj->iTemp);
        }

    Gli_ManStop( p );
    Vec_PtrFree( vNodes );
    Vec_IntFree( vTruth );
    Vec_IntFree( vFanins );
    Vec_WrdFree( vTruths );
    return nSwitches ? 100.0*(nGlitches-nSwitches)/nSwitches : 0.0;
}